

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int tag_size,uint32 tag,CodedInputStream *input,RepeatedField<int> *value)

{
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  uint8 *puVar4;
  uint32 uVar5;
  LogLevel LVar6;
  bool bVar7;
  byte *pbVar8;
  LogMessage *other;
  int iVar9;
  uint32 temp;
  uint32 local_7c;
  uint local_78;
  uint local_74;
  CodedInputStream *local_70;
  LogMessage local_68;
  
  puVar4 = input->buffer_;
  if ((puVar4 < input->buffer_end_) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
    input->buffer_ = puVar4 + 1;
    bVar7 = true;
    local_68.level_ = (int)(char)uVar1;
  }
  else {
    bVar7 = io::CodedInputStream::ReadVarint32Fallback(input,&local_68.level_);
  }
  LVar6 = local_68.level_;
  if (bVar7 == false) {
LAB_001f6db8:
    bVar7 = false;
  }
  else {
    if (value->current_size_ == value->total_size_) {
      RepeatedField<int>::Reserve(value,value->total_size_ + 1);
    }
    iVar9 = value->current_size_;
    value->current_size_ = iVar9 + 1;
    value->elements_[iVar9] = LVar6;
    bVar7 = true;
    iVar9 = value->total_size_ - value->current_size_;
    if (iVar9 != 0 && value->current_size_ <= value->total_size_) {
      local_74 = tag & 0xff | 0x80;
      local_78 = tag >> 7;
      iVar9 = iVar9 + 1;
      local_70 = input;
      do {
        if (tag < 0x80) {
          pbVar8 = local_70->buffer_;
          if ((local_70->buffer_end_ <= pbVar8) || (*pbVar8 != tag)) break;
          pbVar8 = pbVar8 + 1;
        }
        else {
          if ((((0x3fff < tag) ||
               (pbVar8 = local_70->buffer_, *(int *)&local_70->buffer_end_ - (int)pbVar8 < 2)) ||
              (local_74 != *pbVar8)) || (local_78 != pbVar8[1])) break;
          pbVar8 = pbVar8 + 2;
        }
        local_70->buffer_ = pbVar8;
        if ((pbVar8 < local_70->buffer_end_) && (bVar2 = *pbVar8, -1 < (char)bVar2)) {
          local_70->buffer_ = pbVar8 + 1;
          bVar7 = true;
          local_7c = (int)(char)bVar2;
        }
        else {
          bVar7 = io::CodedInputStream::ReadVarint32Fallback(local_70,&local_7c);
        }
        uVar5 = local_7c;
        if (bVar7 == false) goto LAB_001f6db8;
        if (value->total_size_ <= value->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                     ,0x259);
          other = LogMessage::operator<<(&local_68,"CHECK failed: (size()) < (Capacity()): ");
          LogFinisher::operator=((LogFinisher *)&local_7c,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar3 = value->current_size_;
        value->current_size_ = iVar3 + 1;
        value->elements_[iVar3] = uVar5;
        iVar9 = iVar9 + -1;
      } while (1 < iVar9);
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool WireFormatLite::ReadRepeatedPrimitiveNoInline(
    int tag_size,
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* value) {
  return ReadRepeatedPrimitive<CType, DeclaredType>(
      tag_size, tag, input, value);
}